

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

bool __thiscall cmCTestSVN::NoteOldRevision(cmCTestSVN *this)

{
  cmCTest *this_00;
  bool bVar1;
  ostream *poVar2;
  char *msg;
  string local_1f8 [48];
  ostringstream local_1c8 [8];
  ostringstream cmCTestLog_msg;
  string local_50;
  reference local_30;
  SVNInfo *svninfo;
  iterator itend;
  iterator itbeg;
  cmCTestSVN *this_local;
  
  bVar1 = LoadRepositories(this);
  if (bVar1) {
    itend = std::vector<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>::begin
                      (&this->Repositories);
    svninfo = (SVNInfo *)
              std::vector<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>::end
                        (&this->Repositories);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&itend,(__normal_iterator<cmCTestSVN::SVNInfo_*,_std::vector<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>_>
                                 *)&svninfo);
      if (!bVar1) break;
      local_30 = __gnu_cxx::
                 __normal_iterator<cmCTestSVN::SVNInfo_*,_std::vector<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>_>
                 ::operator*(&itend);
      LoadInfo_abi_cxx11_(&local_50,this,local_30);
      std::__cxx11::string::operator=((string *)&local_30->OldRevision,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      poVar2 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                               "Revision for repository \'");
      poVar2 = std::operator<<(poVar2,(string *)local_30);
      poVar2 = std::operator<<(poVar2,"\' before update: ");
      poVar2 = std::operator<<(poVar2,(string *)&local_30->OldRevision);
      std::operator<<(poVar2,"\n");
      std::__cxx11::ostringstream::ostringstream(local_1c8);
      poVar2 = std::operator<<((ostream *)local_1c8,"   Old revision of external repository \'");
      poVar2 = std::operator<<(poVar2,(string *)local_30);
      poVar2 = std::operator<<(poVar2,"\' is: ");
      poVar2 = std::operator<<(poVar2,(string *)&local_30->OldRevision);
      std::operator<<(poVar2,"\n");
      this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
      std::__cxx11::ostringstream::str();
      msg = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(this_00,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestSVN.cxx"
                   ,0x73,msg,false);
      std::__cxx11::string::~string(local_1f8);
      std::__cxx11::ostringstream::~ostringstream(local_1c8);
      __gnu_cxx::
      __normal_iterator<cmCTestSVN::SVNInfo_*,_std::vector<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>_>
      ::operator++(&itend,0);
    }
    std::__cxx11::string::operator=
              ((string *)&(this->super_cmCTestGlobalVC).OldRevision,
               (string *)&this->RootInfo->OldRevision);
    std::__cxx11::string::operator=
              ((string *)&(this->super_cmCTestGlobalVC).PriorRev,
               (string *)&(this->super_cmCTestGlobalVC).OldRevision);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestSVN::NoteOldRevision()
{
  if (!this->LoadRepositories()) {
    return false;
  }

  std::vector<SVNInfo>::iterator itbeg = this->Repositories.begin();
  std::vector<SVNInfo>::iterator itend = this->Repositories.end();
  for (; itbeg != itend; itbeg++) {
    SVNInfo& svninfo = *itbeg;
    svninfo.OldRevision = this->LoadInfo(svninfo);
    this->Log << "Revision for repository '" << svninfo.LocalPath
              << "' before update: " << svninfo.OldRevision << "\n";
    cmCTestLog(
      this->CTest, HANDLER_OUTPUT, "   Old revision of external repository '"
        << svninfo.LocalPath << "' is: " << svninfo.OldRevision << "\n");
  }

  // Set the global old revision to the one of the root
  this->OldRevision = this->RootInfo->OldRevision;
  this->PriorRev.Rev = this->OldRevision;
  return true;
}